

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

Vec_Wrd_t * Ifd_ManDsdTruths(int nVars)

{
  Vec_Wrd_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ifd_Man_t *p;
  bool bVar5;
  int local_54;
  int local_50;
  int c2;
  int c1;
  int c0;
  int k;
  int j;
  int i;
  int v;
  Ifd_Obj_t *pLeaf2;
  Ifd_Obj_t *pLeaf1;
  Ifd_Obj_t *pLeaf0;
  Ifd_Man_t *pMan;
  Vec_Wrd_t *vTruths;
  int fUseMux;
  int nVars_local;
  
  p = Ifd_ManStart();
  j = 2;
  do {
    if (nVars < j) {
      Ifd_ManTruthAll(p);
      Mpm_ComputeCnfSizeAll(p);
      pVVar1 = p->vTruths;
      p->vTruths = (Vec_Wrd_t *)0x0;
      Ifd_ManStop(p);
      return pVVar1;
    }
    for (k = 1; k < j; k = k + 1) {
      for (c0 = 1; c0 < j; c0 = c0 + 1) {
        if (k + c0 == j) {
          c2 = Vec_IntEntry(p->vMarks,k);
          while( true ) {
            iVar2 = Vec_IntEntry(p->vMarks,k + 1);
            bVar5 = false;
            if (c2 < iVar2) {
              pLeaf1 = Ifd_ManObj(p,c2);
              bVar5 = pLeaf1 != (Ifd_Obj_t *)0x0;
            }
            if (!bVar5) break;
            local_50 = Vec_IntEntry(p->vMarks,c0);
            while( true ) {
              iVar2 = Vec_IntEntry(p->vMarks,c0 + 1);
              bVar5 = false;
              if (local_50 < iVar2) {
                pLeaf2 = Ifd_ManObj(p,local_50);
                bVar5 = pLeaf2 != (Ifd_Obj_t *)0x0;
              }
              if (!bVar5) break;
              if ((*(uint *)pLeaf1 >> 0x18 & 0x1f) != k) {
                __assert_fail("(int)pLeaf0->nSupp == i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                              ,0x288,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
              }
              if ((*(uint *)pLeaf2 >> 0x18 & 0x1f) != c0) {
                __assert_fail("(int)pLeaf1->nSupp == j",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                              ,0x289,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
              }
              iVar2 = Abc_Var2Lit(c2,0);
              iVar3 = Abc_Var2Lit(local_50,0);
              Ifd_ManOper(p,iVar2,iVar3,-1,1);
              if (-1 < *(int *)pLeaf2) {
                iVar2 = Abc_Var2Lit(c2,0);
                iVar3 = Abc_Var2Lit(local_50,1);
                Ifd_ManOper(p,iVar2,iVar3,-1,1);
              }
              if (-1 < *(int *)pLeaf1) {
                iVar2 = Abc_Var2Lit(c2,1);
                iVar3 = Abc_Var2Lit(local_50,0);
                Ifd_ManOper(p,iVar2,iVar3,-1,1);
              }
              if ((-1 < *(int *)pLeaf1) && (-1 < *(int *)pLeaf2)) {
                iVar2 = Abc_Var2Lit(c2,1);
                iVar3 = Abc_Var2Lit(local_50,1);
                Ifd_ManOper(p,iVar2,iVar3,-1,1);
              }
              iVar2 = Abc_Var2Lit(c2,0);
              iVar3 = Abc_Var2Lit(local_50,0);
              Ifd_ManOper(p,iVar2,iVar3,-1,2);
              local_50 = local_50 + 1;
            }
            c2 = c2 + 1;
          }
        }
      }
    }
    for (k = 1; k < j + -1; k = k + 1) {
      for (c0 = 1; c0 < j + -1; c0 = c0 + 1) {
        for (c1 = 1; c1 < j + -1; c1 = c1 + 1) {
          if (k + c0 + c1 == j) {
            c2 = Vec_IntEntry(p->vMarks,k);
            while( true ) {
              iVar2 = Vec_IntEntry(p->vMarks,k + 1);
              bVar5 = false;
              if (c2 < iVar2) {
                pLeaf1 = Ifd_ManObj(p,c2);
                bVar5 = pLeaf1 != (Ifd_Obj_t *)0x0;
              }
              if (!bVar5) break;
              local_50 = Vec_IntEntry(p->vMarks,c0);
              while( true ) {
                iVar2 = Vec_IntEntry(p->vMarks,c0 + 1);
                bVar5 = false;
                if (local_50 < iVar2) {
                  pLeaf2 = Ifd_ManObj(p,local_50);
                  bVar5 = pLeaf2 != (Ifd_Obj_t *)0x0;
                }
                if (!bVar5) break;
                local_54 = Vec_IntEntry(p->vMarks,c1);
                while( true ) {
                  iVar2 = Vec_IntEntry(p->vMarks,c1 + 1);
                  bVar5 = false;
                  if (local_54 < iVar2) {
                    _i = Ifd_ManObj(p,local_54);
                    bVar5 = _i != (Ifd_Obj_t *)0x0;
                  }
                  if (!bVar5) break;
                  if ((*(uint *)pLeaf1 >> 0x18 & 0x1f) != k) {
                    __assert_fail("(int)pLeaf0->nSupp == i",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x29f,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if ((*(uint *)pLeaf2 >> 0x18 & 0x1f) != c0) {
                    __assert_fail("(int)pLeaf1->nSupp == j",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x2a0,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if ((*(uint *)_i >> 0x18 & 0x1f) != c1) {
                    __assert_fail("(int)pLeaf2->nSupp == k",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x2a1,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if ((-1 < (int)*(uint *)_i) || (local_50 <= c2)) {
                    iVar2 = Abc_Var2Lit(c2,0);
                    iVar3 = Abc_Var2Lit(local_50,0);
                    iVar4 = Abc_Var2Lit(local_54,0);
                    Ifd_ManOper(p,iVar2,iVar3,iVar4,3);
                    if ((-1 < *(int *)pLeaf1) && (-1 < *(int *)pLeaf2)) {
                      iVar2 = Abc_Var2Lit(c2,1);
                      iVar3 = Abc_Var2Lit(local_50,0);
                      iVar4 = Abc_Var2Lit(local_54,0);
                      Ifd_ManOper(p,iVar2,iVar3,iVar4,3);
                    }
                  }
                  local_54 = local_54 + 1;
                }
                local_50 = local_50 + 1;
              }
              c2 = c2 + 1;
            }
          }
        }
      }
    }
    Vec_IntPush(p->vMarks,p->nObjs);
    j = j + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Ifd_ManDsdTruths( int nVars )
{
    int fUseMux = 1;
    Vec_Wrd_t * vTruths;
    Ifd_Man_t * pMan = Ifd_ManStart();
    Ifd_Obj_t * pLeaf0, * pLeaf1, * pLeaf2;
    int v, i, j, k, c0, c1, c2;
    for ( v = 2; v <= nVars; v++ )
    {
        // create ANDs/XORs
        for ( i = 1; i < v; i++ )
        for ( j = 1; j < v; j++ )
        if ( i + j == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 1), -1, 1 );
                if ( !pLeaf0->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 1), -1, 1 );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 2 );
            }
        }
        // create MUX
        if ( fUseMux )
        for ( i = 1; i < v-1; i++ )
        for ( j = 1; j < v-1; j++ )
        for ( k = 1; k < v-1; k++ )
        if ( i + j + k == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            Ifd_ManForEachNodeWithSupp( pMan, k, pLeaf2, c2 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                assert( (int)pLeaf2->nSupp == k );
//printf( "%d %d %d   ", i, j, k );
//printf( "%d %d %d\n", Ifd_ObjId(pMan, pLeaf0), Ifd_ObjId(pMan, pLeaf1), Ifd_ObjId(pMan, pLeaf2) );
                if ( pLeaf2->fWay && c0 < c1 )
                    continue;
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
            }
        }
        // bookmark
        Vec_IntPush( pMan->vMarks, pMan->nObjs );
    }
    Ifd_ManTruthAll( pMan );
    Mpm_ComputeCnfSizeAll( pMan );
//    Ifd_ManPrint( pMan );
    vTruths = pMan->vTruths; pMan->vTruths = NULL;
    Ifd_ManStop( pMan );
    return vTruths;
}